

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xxmrghw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 dst_01;
  TCGv_i64 dst_02;
  TCGv_i64 ret;
  TCGv_i64 tmp;
  TCGv_i64 b1;
  TCGv_i64 b0;
  TCGv_i64 a1;
  TCGv_i64 a0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    dst = tcg_temp_new_i64(tcg_ctx_00);
    dst_00 = tcg_temp_new_i64(tcg_ctx_00);
    dst_01 = tcg_temp_new_i64(tcg_ctx_00);
    dst_02 = tcg_temp_new_i64(tcg_ctx_00);
    ret = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = xA(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,uVar1);
    uVar1 = xA(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst_00,uVar1);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst_01,uVar1);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst_02,uVar1);
    tcg_gen_shri_i64_ppc64(tcg_ctx_00,dst,dst,0x20);
    tcg_gen_shri_i64_ppc64(tcg_ctx_00,dst_01,dst_01,0x20);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,dst_01,dst,0x20,0x20);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1,ret);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,dst_02,dst_00,0x20,0x20);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrl(tcg_ctx_00,uVar1,ret);
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,dst_00);
    tcg_temp_free_i64(tcg_ctx_00,dst_01);
    tcg_temp_free_i64(tcg_ctx_00,dst_02);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xxsel(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = xT(ctx->opcode);
    int ra = xA(ctx->opcode);
    int rb = xB(ctx->opcode);
    int rc = xC(ctx->opcode);

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    tcg_gen_gvec_bitsel(tcg_ctx, MO_64, vsr_full_offset(rt), vsr_full_offset(rc),
                        vsr_full_offset(rb), vsr_full_offset(ra), 16, 16);
}